

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdk.cpp
# Opt level: O3

float SDK::distanceTo(Vec2 start,Vec2 end)

{
  Router *this;
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vector<Vec2,_std::allocator<Vec2>_> path;
  float local_48;
  float fStack_44;
  vector<Vec2,_std::allocator<Vec2>_> local_20;
  
  this = Router::getInstance();
  Router::Route(&local_20,this,start,end);
  if (local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    fVar3 = 1e+08;
    if (local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return 1e+08;
    }
  }
  else {
    local_48 = start.x;
    fStack_44 = start.y;
    local_48 = (local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start)->x - local_48;
    fStack_44 = (local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                 super__Vector_impl_data._M_start)->y - fStack_44;
    fVar3 = SQRT(local_48 * local_48 + fStack_44 * fStack_44);
    uVar1 = (long)local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (1 < uVar1) {
      uVar2 = 1;
      do {
        fVar5 = local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2].x -
                local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2 - 1].x;
        fVar4 = local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2].y -
                local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2 - 1].y;
        fVar3 = fVar3 + SQRT(fVar5 * fVar5 + fVar4 * fVar4);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  operator_delete(local_20.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return fVar3;
}

Assistant:

float SDK::distanceTo(Vec2 start, Vec2 end)
{
    auto path = routeTo(start, end);
    if (path.empty())
        return FINF;
    float res = (path[0] - start).length();
    for (int i = 1; i < path.size(); ++i)
        res += (path[i] - path[i - 1]).length();
    return res;
}